

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O2

void __thiscall DataSet::load(DataSet *this,string *filepath,ReadInfo *info)

{
  Matrix<double> *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  istream *piVar4;
  vector<double,_std::allocator<double>_> *this_01;
  uint uVar5;
  uint index;
  uint local_5a4;
  string line;
  string token;
  stringstream stream_1;
  undefined1 local_538 [376];
  stringstream stream;
  ostream local_3b0 [8];
  string local_3a8 [368];
  ifstream file;
  byte abStack_218 [488];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&file,(string *)filepath,_S_in);
  if ((abStack_218[*(long *)(_file + -0x18)] & 5) == 0) {
    local_5a4 = 0;
    uVar3 = 0;
    if (info->shape_skip == false) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&file,(string *)&line);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&stream_1,(string *)&line,_S_out|_S_in);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&stream_1,(string *)&token,',');
      uVar3 = std::__cxx11::stoi(&token,(size_t *)0x0,10);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&stream_1,(string *)&token,',');
      local_5a4 = std::__cxx11::stoi(&token,(size_t *)0x0,10);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream_1);
    }
    if (info->header_skip == false) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&file,(string *)&line);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&stream_1,(string *)&line,_S_out|_S_in);
      while( true ) {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&stream_1,(string *)&token,',');
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->m_labels,&token);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream_1);
    }
    this_00 = &this->m_matrix;
    index = 0;
    while( true ) {
      do {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&file,(string *)&line);
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
          if (uVar3 != index && uVar3 != 0) {
            std::operator<<((ostream *)&std::cout,"WARNING [loading file]: Shape doesn\'t match!\n")
            ;
          }
          std::ifstream::close();
          std::ifstream::~ifstream(&file);
          std::__cxx11::string::~string((string *)&token);
          std::__cxx11::string::~string((string *)&line);
          std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
          return;
        }
      } while ((line._M_string_length == 0) && (info->empty_line_skip != false));
      std::operator<<(local_3b0,(string *)&line);
      Matrix<double>::add_row(this_00,1);
      uVar5 = 0;
      while( true ) {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&stream,(string *)&token,',');
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
        this_01 = Matrix<double>::operator[](this_00,index);
        _stream_1 = (undefined1 *)std::__cxx11::stod(&token,(size_t *)0x0);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (this_01,(double *)&stream_1);
        uVar5 = uVar5 + 1;
      }
      if ((local_5a4 != uVar5 && local_5a4 != 0) ||
         (uVar1 = (this_00->m_shape).n_row, uVar2 = (this_00->m_shape).n_col,
         uVar2 != uVar5 && index != 0)) break;
      (this->m_matrix).m_shape.n_row = uVar1;
      (this->m_matrix).m_shape.n_col = uVar5;
      _stream_1 = local_538;
      local_538[0] = 0;
      std::__cxx11::stringbuf::str(local_3a8);
      index = index + 1;
      std::__cxx11::string::~string((string *)&stream_1);
      std::ios::clear((int)*(undefined8 *)(_stream + -0x18) + (int)&stream);
    }
    std::operator<<((ostream *)&std::cout,"ERROR [file loading]: Different dimensions!\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"ERROR [loading file]: Couldn\'t open up the file!\n");
  }
  exit(1);
}

Assistant:

void DataSet::load(const std::string& filepath, const ReadInfo& info){
    unsigned n_row=0, n_col=0;
    Shape shape;
    
    std::stringstream stream;
    std::string line, token;
    std::ifstream file(filepath);

    if(!file){
        std::cout<<"ERROR [loading file]: Couldn't open up the file!\n";
        exit(1);
    }

    if(!info.shape_skip){
        std::getline(file, line);
        std::stringstream stream(line);

        std::getline(stream, token, ',');
        shape.n_row=std::stoi(token);
        std::getline(stream, token, ',');
        shape.n_col=std::stoi(token);
    }
    if(!info.header_skip){
        std::getline(file, line);
        std::stringstream stream(line);
        while(std::getline(stream, token, ',')){
            m_labels.push_back(token);
        }
    }

    while(std::getline(file, line)){
        if(line.empty() && info.empty_line_skip) continue;

        stream<<line;
        m_matrix.add_row();
        while(std::getline(stream, token, ',')){
            m_matrix[n_row].push_back(std::stod(token));
            ++n_col;
        }

        if( (shape.n_col && shape.n_col!=n_col) || 
            (n_row && n_col!=m_matrix.shape().n_col) ){
            std::cout<<"ERROR [file loading]: Different dimensions!\n";
            exit(1);
        }

        m_matrix.set_shape(m_matrix.shape().n_row, n_col);
        n_col=0; ++n_row;
        stream.str(std::string());
        stream.clear();
    }

    if(shape.n_row && shape.n_row!=n_row){
        std::cout<<"WARNING [loading file]: Shape doesn't match!\n";
    }

    file.close();
}